

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lighting_database.cpp
# Opt level: O0

void LightingDb::create_dir_light(void)

{
  vec<3,_float,_(glm::qualifier)0> local_d8;
  vec<3,_float,_(glm::qualifier)0> local_cc;
  vec<3,_float,_(glm::qualifier)0> local_c0;
  PhongLight local_b4;
  vec<3,_float,_(glm::qualifier)0> local_90;
  DirectionalLight local_84;
  size_t local_50;
  pair<unsigned_long,_DirectionalLight> local_48;
  
  local_50 = create_dir_light::directional_light_counter;
  create_dir_light::directional_light_counter = create_dir_light::directional_light_counter + 1;
  glm::vec<3,_float,_(glm::qualifier)0>::vec(&local_90,1.0,1.0,1.0);
  glm::vec<3,_float,_(glm::qualifier)0>::vec(&local_c0,0.1,0.1,0.1);
  glm::vec<3,_float,_(glm::qualifier)0>::vec(&local_cc,1.0,1.0,1.0);
  glm::vec<3,_float,_(glm::qualifier)0>::vec(&local_d8,0.1,0.1,0.1);
  PhongLight::PhongLight(&local_b4,&local_c0,&local_cc,&local_d8);
  DirectionalLight::DirectionalLight(&local_84,&local_90,&local_b4);
  std::make_pair<unsigned_long,DirectionalLight>(&local_48,&local_50,&local_84);
  std::
  unordered_map<unsigned_long,DirectionalLight,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,DirectionalLight>>>
  ::emplace<std::pair<unsigned_long,DirectionalLight>>
            ((unordered_map<unsigned_long,DirectionalLight,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,DirectionalLight>>>
              *)dir_map,&local_48);
  return;
}

Assistant:

void LightingDb::create_dir_light() noexcept
{
    static std::size_t directional_light_counter = 1;
    dir_map.emplace(
        std::make_pair(
            directional_light_counter++,
            DirectionalLight(
                {1.0f, 1.0f, 1.0f},
                PhongLight(
                    {0.1f, 0.1f, 0.1f},
                    {1.0f, 1.0f, 1.0f},
                    {0.1f, 0.1f, 0.1f}))));
}